

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyNPY.cpp
# Opt level: O3

LPCSTR NpyArray::LoadArrayNPZ(FILE *fp,string *varname,NpyArray *arr)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  string vname;
  char localHeader [32];
  undefined1 *local_78;
  size_t local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [2];
  char local_56;
  char local_55;
  short local_50;
  uint32_t local_46;
  uint local_42;
  ushort local_3e;
  ushort local_3c;
  
  sVar2 = fread(local_58,1,0x1e,(FILE *)fp);
  if (sVar2 != 0x1e) {
    return "error: failed fread";
  }
  if (local_56 != '\x03') {
    return (LPCSTR)0x1;
  }
  if (local_55 != '\x04') {
    return (LPCSTR)0x1;
  }
  local_78 = local_68;
  std::__cxx11::string::_M_construct((ulong)&local_78,(char)local_3e);
  sVar2 = fread(local_78,1,(ulong)local_3e,(FILE *)fp);
  if (sVar2 == local_3e) {
    local_78[local_70 - 4] = 0;
    local_70 = local_70 - 4;
    fseek((FILE *)fp,(ulong)local_3c,1);
    sVar2 = varname->_M_string_length;
    if (sVar2 == 0) {
      std::__cxx11::string::_M_assign((string *)varname);
    }
    else if ((sVar2 != local_70) ||
            (iVar1 = bcmp((varname->_M_dataplus)._M_p,local_78,sVar2), iVar1 != 0)) {
      fseek((FILE *)fp,(ulong)local_42,1);
      pcVar3 = (LPCSTR)0x0;
      goto LAB_0011671a;
    }
    if (local_50 == 0) {
      pcVar3 = LoadNPY(arr,fp);
    }
    else {
      pcVar3 = LoadNPZ(arr,fp,local_46,local_42);
    }
  }
  else {
    pcVar3 = "error: failed fread";
  }
LAB_0011671a:
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  return pcVar3;
}

Assistant:

LPCSTR NpyArray::LoadArrayNPZ(FILE* fp, std::string& varname, NpyArray& arr)
{
	char localHeader[32];
	if (fread(localHeader, sizeof(char), 30, fp) != 30)
		return "error: failed fread";

	// if we've reached the global header, stop reading
	if (localHeader[2] != 0x03 || localHeader[3] != 0x04)
		return (const char*)1;

	// read in the variable name
	const uint16_t lenName = *reinterpret_cast<uint16_t*>(localHeader+26);
	std::string vname(lenName, ' ');
	if (fread(&vname[0], sizeof(char), lenName, fp) != lenName)
		return "error: failed fread";

	// erase the lagging .npy        
	vname.erase(vname.end()-4, vname.end());

	// read in the extra field
	const uint16_t lenExtraField = *reinterpret_cast<uint16_t*>(localHeader+28);
	fseek(fp, lenExtraField, SEEK_CUR); // skip past the extra field

	if (varname.empty() || varname == vname) {
		// read current array
		if (varname.empty())
			varname = vname;
		const uint16_t comprMethod = *reinterpret_cast<uint16_t*>(localHeader+8);
		if (comprMethod == 0)
			return arr.LoadNPY(fp);
		const uint32_t comprBytes = *reinterpret_cast<uint32_t*>(localHeader+18);
		const uint32_t uncomprBytes = *reinterpret_cast<uint32_t*>(localHeader+22);
		return arr.LoadNPZ(fp, comprBytes, uncomprBytes);
	}

	// skip current array data
	const uint32_t size = *reinterpret_cast<uint32_t*>(localHeader+22);
	fseek(fp, size, SEEK_CUR);
	return NULL;
}